

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O0

QImage * __thiscall
QRawFont::alphaMapForGlyph
          (QRawFont *this,quint32 glyphIndex,AntialiasingType antialiasingType,QTransform *transform
          )

{
  bool bVar1;
  QRawFontPrivate *pQVar2;
  int in_ECX;
  uint in_EDX;
  QImage *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QImage *in_stack_ffffffffffffff60;
  QFontEngine *pQVar3;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x7908bf);
  bVar1 = QRawFontPrivate::isValid(pQVar2);
  if (bVar1) {
    pQVar2 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x7908e4);
    if (pQVar2->fontEngine->glyphFormat == Format_ARGB) {
      pQVar2 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x7908fa);
      pQVar3 = pQVar2->fontEngine;
      QFixedPoint::QFixedPoint((QFixedPoint *)in_stack_ffffffffffffff60);
      QColor::QColor((QColor *)0x79092e);
      (*pQVar3->_vptr_QFontEngine[0x16])(in_RDI,pQVar3,(ulong)in_EDX,local_20,in_R8,local_18);
    }
    else if (in_ECX == 1) {
      pQVar2 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x790970);
      pQVar3 = pQVar2->fontEngine;
      QFixedPoint::QFixedPoint((QFixedPoint *)in_stack_ffffffffffffff60);
      (*pQVar3->_vptr_QFontEngine[0x15])(in_RDI,pQVar3,(ulong)in_EDX,local_28,in_R8);
    }
    else {
      pQVar2 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x7909bd);
      pQVar3 = pQVar2->fontEngine;
      QFixedPoint::QFixedPoint((QFixedPoint *)pQVar3);
      (**(code **)(*(long *)&pQVar3->_vptr_QFontEngine + 0xa0))(in_RDI,pQVar3,in_EDX,local_30,in_R8)
      ;
    }
  }
  else {
    QImage::QImage(in_stack_ffffffffffffff60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QImage QRawFont::alphaMapForGlyph(quint32 glyphIndex, AntialiasingType antialiasingType,
                                  const QTransform &transform) const
{
    if (!d->isValid())
        return QImage();

    if (d->fontEngine->glyphFormat == QFontEngine::Format_ARGB)
        return d->fontEngine->bitmapForGlyph(glyphIndex, QFixedPoint(), transform);

    if (antialiasingType == SubPixelAntialiasing)
        return d->fontEngine->alphaRGBMapForGlyph(glyphIndex, QFixedPoint(), transform);

    return d->fontEngine->alphaMapForGlyph(glyphIndex, QFixedPoint(), transform);
}